

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O2

int h264_level(bitstream *str,int suffixLength,int onebias,int32_t *val)

{
  int size;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint32_t level_suffix;
  uint32_t tmp;
  int local_44;
  bitstream *local_40;
  uint *local_38;
  
  if (str->dir == VS_ENCODE) {
    iVar5 = *val;
    uVar3 = iVar5 * 2 - 2;
    if (iVar5 < 0) {
      uVar3 = ~(iVar5 * 2);
    }
    level_suffix = uVar3 - 2;
    if (onebias == 0) {
      level_suffix = uVar3;
    }
    uVar3 = 0;
    iVar5 = 0xe;
    iVar1 = 1;
    do {
      bVar6 = iVar5 != 0;
      iVar5 = iVar5 + -1;
      iVar2 = 4;
      if (bVar6) {
        iVar2 = suffixLength;
      }
      if (suffixLength != 0) {
        iVar2 = suffixLength;
      }
      size = uVar3 - 3;
      if (uVar3 < 0xf) {
        size = iVar2;
      }
      uVar4 = 1 << ((byte)size & 0x1f);
      if (level_suffix < uVar4) {
        tmp = 1;
        iVar5 = vs_u(str,&tmp,1);
        if (iVar5 != 0) {
          return 1;
        }
        if ((size != 0) && (iVar5 = vs_u(str,&level_suffix,size), iVar5 != 0)) {
          return 1;
        }
        goto LAB_0010ac55;
      }
      uVar3 = uVar3 + 1;
      tmp = 0;
      level_suffix = level_suffix - uVar4;
      iVar2 = vs_u(str,&tmp,1);
    } while (iVar2 == 0);
  }
  else {
    uVar4 = 0;
    iVar5 = 0xe;
    uVar3 = 0;
    local_44 = onebias;
    local_40 = str;
    local_38 = (uint *)val;
    while( true ) {
      bVar6 = iVar5 != 0;
      iVar5 = iVar5 + -1;
      iVar1 = 4;
      if (bVar6) {
        iVar1 = suffixLength;
      }
      if (suffixLength != 0) {
        iVar1 = suffixLength;
      }
      iVar2 = uVar3 - 3;
      if (uVar3 < 0xf) {
        iVar2 = iVar1;
      }
      iVar1 = vs_u(local_40,&tmp,1);
      if (iVar1 != 0) {
        return 1;
      }
      if (tmp != 0) break;
      uVar4 = uVar4 + (1 << ((byte)iVar2 & 0x1f));
      uVar3 = uVar3 + 1;
    }
    if (iVar2 != 0) {
      iVar5 = vs_u(local_40,&level_suffix,iVar2);
      if (iVar5 != 0) {
        return 1;
      }
      uVar4 = uVar4 + level_suffix;
    }
    uVar3 = uVar4 + 2;
    if (local_44 == 0) {
      uVar3 = uVar4;
    }
    uVar4 = ~((int)uVar3 >> 1);
    if ((uVar3 & 1) == 0) {
      uVar4 = (int)(uVar3 + 2) >> 1;
    }
    *local_38 = uVar4;
LAB_0010ac55:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int h264_level(struct bitstream *str, int suffixLength, int onebias, int32_t *val) {
	/*
	 * each level_prefix takes 1 << suffix_size consecutive level_codes from the code space
	 * level_prefix 0..13:
	 *   suffix size = suffixLength
	 * level prefix 14:
	 *   suffix size = suffixLength ? suffixLength : 4
	 * level prefix 15+:
	 *   suffix size = level_prefix - 3 [thus 12+]
	 */
	int suffix_size;
	int level_code;
	int level_prefix;
	uint32_t level_suffix;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val < 0)
			level_code = -((*val << 1) + 1);
		else
			level_code = ((*val << 1) - 2);
		if (onebias)
			level_code -= 2;

		level_prefix = 0;
		level_suffix = level_code;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (level_suffix < (1 << suffix_size))
				break;
			level_suffix -= (1 << suffix_size);
			level_prefix++;
			tmp = 0;
			if (vs_u(str, &tmp, 1)) return 1;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1)) return 1;
		if (suffix_size)
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
	} else {
		level_code = 0;
		level_prefix = 0;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (vs_u(str, &tmp, 1)) return 1;
			if (tmp)
				break;
			level_code += (1 << suffix_size);
			level_prefix++;
		}
		if (suffix_size) {
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
			level_code += level_suffix;
		}

		if (onebias)
			level_code += 2;
		if (level_code & 1)
			*val = (-level_code - 1) >> 1;
		else
			*val = (level_code + 2) >> 1;
	}
	return 0;
}